

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerNewScObjArray(Lowerer *this,Instr *newObjInstr)

{
  OpCode opcode;
  code *pcVar1;
  LabelInstr *pLVar2;
  intptr_t iVar3;
  ArrayCallSiteInfo *pAVar4;
  Func *compareSrc1;
  bool bVar5;
  ArgSlot AVar6;
  BailOutKind BVar7;
  BailOutKind BVar8;
  uint32 uVar9;
  uint uVar10;
  uint32 uVar11;
  Instr *pIVar12;
  undefined4 *puVar13;
  Opnd *pOVar14;
  Opnd *pOVar15;
  Opnd *src2Opnd;
  ProfiledInstr *pPVar16;
  JITTimeProfileInfo *pJVar17;
  SymOpnd *pSVar18;
  RegOpnd *pRVar19;
  AddrOpnd *pAVar20;
  HelperCallOpnd *newSrc;
  IndirOpnd *pIVar21;
  BranchInstr *branchInstr_00;
  IntConstOpnd *src;
  bool local_10a;
  bool local_109;
  BranchInstr *branchInstr;
  JnHelperMethod helperMethod;
  Opnd *profileOpnd;
  Instr *startCallInstr;
  bool local_b5;
  int32 length;
  bool emittedFastPath;
  Opnd *pOStack_b0;
  uint16 upperBoundValue;
  Opnd *opndOfArrayCtor;
  Instr *argInstr;
  StackSym *linkSym;
  Opnd *linkOpnd;
  LabelInstr *labelDone;
  LabelInstr *helperLabel;
  Instr *pIStack_78;
  ProfileId profileId;
  Instr *insertInstr;
  RegOpnd *resultObjOpnd;
  intptr_t arrayInfoAddr;
  ArrayCallSiteInfo *arrayInfo;
  intptr_t weakFuncRef;
  ProfiledInstr *instrNew;
  LabelInstr *labelSkipBailOut;
  Func *func;
  Opnd *targetOpnd;
  Instr *startMarkerInstr;
  Instr *newObjInstr_local;
  Lowerer *this_local;
  
  startMarkerInstr = newObjInstr;
  newObjInstr_local = (Instr *)this;
  bVar5 = IR::Instr::HasEmptyArgOutChain(newObjInstr,(Instr **)0x0);
  if (bVar5) {
    IR::Instr::FreeSrc2(startMarkerInstr);
    this_local = (Lowerer *)LowerNewScObjArrayNoArg(this,startMarkerInstr);
  }
  else {
    targetOpnd = (Opnd *)0x0;
    func = (Func *)IR::Instr::GetSrc1(startMarkerInstr);
    labelSkipBailOut = (LabelInstr *)startMarkerInstr->m_func;
    bVar5 = IR::Opnd::IsAddrOpnd((Opnd *)func);
    if (bVar5) {
      targetOpnd = (Opnd *)InsertLoweredRegionStartMarker(this,startMarkerInstr);
    }
    else {
      bVar5 = IR::Instr::HasBailOutInfo(startMarkerInstr);
      if ((!bVar5) || (bVar5 = IR::Instr::OnlyHasLazyBailOut(startMarkerInstr), bVar5)) {
        pIVar12 = LowerNewScObject(this,startMarkerInstr,true,true,false);
        return pIVar12;
      }
      targetOpnd = (Opnd *)InsertLoweredRegionStartMarker(this,startMarkerInstr);
      BVar7 = IR::Instr::GetBailOutKind(startMarkerInstr);
      if (BVar7 != BailOutOnNotNativeArray) {
        BVar7 = IR::Instr::GetBailOutKind(startMarkerInstr);
        BVar8 = BailOutInfo::WithLazyBailOut(BailOutOnNotNativeArray);
        if (BVar7 != BVar8) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x1462,
                             "(newObjInstr->GetBailOutKind() == IR::BailOutOnNotNativeArray || newObjInstr->GetBailOutKind() == BailOutInfo::WithLazyBailOut(IR::BailOutOnNotNativeArray))"
                             ,
                             "newObjInstr->GetBailOutKind() == IR::BailOutOnNotNativeArray || newObjInstr->GetBailOutKind() == BailOutInfo::WithLazyBailOut(IR::BailOutOnNotNativeArray)"
                            );
          if (!bVar5) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 0;
        }
      }
      instrNew = (ProfiledInstr *)IR::LabelInstr::New(Label,(Func *)labelSkipBailOut,false);
      compareSrc1 = func;
      pOVar14 = LoadLibraryValueOpnd(this,startMarkerInstr,ValueArrayConstructor);
      InsertCompareBranch(this,(Opnd *)compareSrc1,pOVar14,BrEq_A,true,(LabelInstr *)instrNew,
                          startMarkerInstr,false);
      opcode = startMarkerInstr->m_opcode;
      pOVar14 = IR::Instr::UnlinkDst(startMarkerInstr);
      pOVar15 = IR::Instr::UnlinkSrc1(startMarkerInstr);
      src2Opnd = IR::Instr::UnlinkSrc2(startMarkerInstr);
      weakFuncRef = (intptr_t)
                    IR::ProfiledInstr::New(opcode,pOVar14,pOVar15,src2Opnd,(Func *)labelSkipBailOut)
      ;
      pPVar16 = IR::Instr::AsProfiledInstr(startMarkerInstr);
      *(uint *)(weakFuncRef + 0x58) = (pPVar16->u).profileId;
      IR::Instr::InsertAfter(startMarkerInstr,(Instr *)weakFuncRef);
      startMarkerInstr->m_opcode = BailOut;
      GenerateBailOut(this,startMarkerInstr,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
      IR::Instr::InsertBefore((Instr *)weakFuncRef,&instrNew->super_Instr);
      startMarkerInstr = (Instr *)weakFuncRef;
    }
    arrayInfo = (ArrayCallSiteInfo *)0x0;
    arrayInfoAddr = 0;
    resultObjOpnd = (RegOpnd *)0x0;
    bVar5 = IR::Instr::IsProfiledInstr(startMarkerInstr);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1480,"(newObjInstr->IsProfiledInstr())","newObjInstr->IsProfiledInstr()"
                        );
      if (!bVar5) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 0;
    }
    pOVar14 = IR::Instr::GetDst(startMarkerInstr);
    insertInstr = (Instr *)IR::Opnd::AsRegOpnd(pOVar14);
    pIStack_78 = startMarkerInstr->m_next;
    pPVar16 = IR::Instr::AsProfiledInstr(startMarkerInstr);
    helperLabel._6_2_ = (pPVar16->u).field_3.fldInfoData.f1;
    if (helperLabel._6_2_ != 0xffff) {
      pJVar17 = Func::GetReadOnlyProfileInfo((Func *)labelSkipBailOut);
      arrayInfoAddr = (intptr_t)JITTimeProfileInfo::GetArrayCallSiteInfo(pJVar17,helperLabel._6_2_);
      pJVar17 = Func::GetReadOnlyProfileInfo((Func *)labelSkipBailOut);
      resultObjOpnd =
           (RegOpnd *)JITTimeProfileInfo::GetArrayCallSiteInfoAddr(pJVar17,helperLabel._6_2_);
      if (arrayInfoAddr == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x148c,"(arrayInfo)","arrayInfo");
        if (!bVar5) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 0;
      }
      arrayInfo = (ArrayCallSiteInfo *)Func::GetWeakFuncRef((Func *)labelSkipBailOut);
      if (arrayInfo == (ArrayCallSiteInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x148e,"(weakFuncRef)","weakFuncRef");
        if (!bVar5) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 0;
      }
    }
    labelDone = IR::LabelInstr::New(Label,(Func *)labelSkipBailOut,true);
    linkOpnd = (Opnd *)IR::LabelInstr::New(Label,(Func *)labelSkipBailOut,false);
    linkSym = (StackSym *)IR::Instr::GetSrc2(startMarkerInstr);
    bVar5 = IR::Opnd::IsSymOpnd((Opnd *)linkSym);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1495,"(linkOpnd->IsSymOpnd())","linkOpnd->IsSymOpnd()");
      if (!bVar5) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 0;
    }
    pSVar18 = IR::Opnd::AsSymOpnd((Opnd *)linkSym);
    argInstr = (Instr *)Sym::AsStackSym(pSVar18->m_sym);
    bVar5 = StackSym::IsSingleDef((StackSym *)argInstr);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1497,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
      if (!bVar5) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 0;
    }
    opndOfArrayCtor = (Opnd *)StackSym::GetInstrDef((StackSym *)argInstr);
    pOStack_b0 = IR::Instr::GetSrc1((Instr *)opndOfArrayCtor);
    length._2_2_ = 8;
    length._0_2_ = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                   IR::Opnd::GetValueType(pOStack_b0);
    bVar5 = ValueType::IsLikelyInt((ValueType *)&length);
    local_109 = false;
    if (bVar5) {
      bVar5 = IR::Opnd::IsAddrOpnd(pOStack_b0);
      local_10a = true;
      if (!bVar5) {
        local_10a = IR::Opnd::IsRegOpnd(pOStack_b0);
      }
      local_109 = local_10a;
    }
    if ((local_109 != false) && (AVar6 = StackSym::GetArgSlotNum((StackSym *)argInstr), AVar6 == 2))
    {
      bVar5 = StackSym::IsArgSlotSym((StackSym *)argInstr);
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x14a3,"(linkSym->IsArgSlotSym())","Not an argSlot symbol...");
        if (!bVar5) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 0;
      }
      linkSym = (StackSym *)IR::Instr::GetSrc2((Instr *)opndOfArrayCtor);
      local_b5 = false;
      bVar5 = IR::Opnd::IsRegOpnd(pOStack_b0);
      if (bVar5) {
        pRVar19 = IR::Opnd::AsRegOpnd(pOStack_b0);
        bVar5 = IR::Opnd::IsNotInt(&pRVar19->super_Opnd);
        if (!bVar5) {
          if ((arrayInfoAddr == 0) ||
             (bVar5 = Js::ArrayCallSiteInfo::IsNativeIntArray((ArrayCallSiteInfo *)arrayInfoAddr),
             pIVar12 = startMarkerInstr, pAVar4 = arrayInfo, iVar3 = arrayInfoAddr,
             pRVar19 = resultObjOpnd, pLVar2 = labelDone, pOVar15 = linkOpnd, pOVar14 = pOStack_b0,
             !bVar5)) {
            if ((arrayInfoAddr == 0) ||
               (bVar5 = Js::ArrayCallSiteInfo::IsNativeFloatArray
                                  ((ArrayCallSiteInfo *)arrayInfoAddr), pIVar12 = startMarkerInstr,
               pAVar4 = arrayInfo, iVar3 = arrayInfoAddr, pRVar19 = resultObjOpnd,
               pLVar2 = labelDone, pOVar15 = linkOpnd, pOVar14 = pOStack_b0, !bVar5)) {
              local_b5 = GenerateProfiledNewScObjArrayFastPath<Js::JavascriptArray>
                                   (this,startMarkerInstr,(ArrayCallSiteInfo *)arrayInfoAddr,
                                    (intptr_t)resultObjOpnd,(intptr_t)arrayInfo,labelDone,
                                    (LabelInstr *)linkOpnd,pOStack_b0,0,0);
            }
            else {
              uVar11 = Js::JavascriptNativeArray::GetOffsetOfArrayCallSiteIndex();
              uVar9 = Js::JavascriptNativeArray::GetOffsetOfWeakFuncRef();
              local_b5 = GenerateProfiledNewScObjArrayFastPath<Js::JavascriptNativeFloatArray>
                                   (this,pIVar12,(ArrayCallSiteInfo *)iVar3,(intptr_t)pRVar19,
                                    (intptr_t)pAVar4,pLVar2,(LabelInstr *)pOVar15,pOVar14,uVar11,
                                    uVar9);
            }
          }
          else {
            uVar11 = Js::JavascriptNativeArray::GetOffsetOfArrayCallSiteIndex();
            uVar9 = Js::JavascriptNativeArray::GetOffsetOfWeakFuncRef();
            local_b5 = GenerateProfiledNewScObjArrayFastPath<Js::JavascriptNativeIntArray>
                                 (this,pIVar12,(ArrayCallSiteInfo *)iVar3,(intptr_t)pRVar19,
                                  (intptr_t)pAVar4,pLVar2,(LabelInstr *)pOVar15,pOVar14,uVar11,uVar9
                                 );
          }
        }
      }
      else {
        uVar11 = StackSym::GetIntConstValue((StackSym *)argInstr);
        if ((-1 < (int)uVar11) && ((int)uVar11 < 9)) {
          local_b5 = GenerateProfiledNewScObjArrayFastPath
                               (this,startMarkerInstr,(ArrayCallSiteInfo *)arrayInfoAddr,
                                (intptr_t)resultObjOpnd,(intptr_t)arrayInfo,uVar11,
                                (LabelInstr *)linkOpnd,false);
        }
      }
      if (local_b5 != false) {
        pRVar19 = IR::Opnd::AsRegOpnd((Opnd *)linkSym);
        argInstr = (Instr *)Sym::AsStackSym(&pRVar19->m_sym->super_Sym);
        bVar5 = StackSym::IsArgSlotSym((StackSym *)argInstr);
        if ((bVar5) || (((ulong)argInstr->m_prev & 1) == 0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x14cc,"(!linkSym->IsArgSlotSym() && linkSym->m_isSingleDef)",
                             "Arg tree not single def...");
          if (!bVar5) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 0;
        }
        pIVar12 = (Instr *)argInstr->globOptInstrString;
        uVar10 = IR::Instr::GetArgOutCount(pIVar12,false);
        if (uVar10 != 2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x14cf,"(startCallInstr->GetArgOutCount(false) == 2)",
                             "Generating ArrayFastPath for more than 1 parameter not allowed.");
          if (!bVar5) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 0;
        }
        IR::Instr::Move(pIVar12,startMarkerInstr);
        IR::Instr::Move((Instr *)opndOfArrayCtor,startMarkerInstr);
      }
    }
    IR::Instr::UnlinkSrc1(startMarkerInstr);
    pAVar20 = IR::AddrOpnd::New((intptr_t)resultObjOpnd,AddrOpndKindDynamicArrayCallSiteInfo,
                                (Func *)labelSkipBailOut,false,(Var)0x0);
    LowererMD::LoadNewScObjFirstArg(&this->m_lowererMD,startMarkerInstr,&pAVar20->super_Opnd,0);
    pIVar12 = startMarkerInstr;
    newSrc = IR::HelperCallOpnd::New(HelperScrArr_ProfiledNewInstance,(Func *)labelSkipBailOut);
    IR::Instr::SetSrc1(pIVar12,&newSrc->super_Opnd);
    startMarkerInstr = GenerateDirectCall(this,startMarkerInstr,(Opnd *)func,1);
    pIVar21 = IR::IndirOpnd::New((RegOpnd *)insertInstr,0,TyUint64,(Func *)labelSkipBailOut,false);
    pOVar14 = LoadVTableValueOpnd(this,pIStack_78,VtableJavascriptArray);
    branchInstr_00 =
         InsertCompareBranch(this,&pIVar21->super_Opnd,pOVar14,BrEq_A,true,(LabelInstr *)linkOpnd,
                             pIStack_78,false);
    InsertObjectPoison((Opnd *)insertInstr,branchInstr_00,pIStack_78,true);
    pIVar12 = insertInstr;
    uVar11 = Js::JavascriptNativeArray::GetOffsetOfArrayCallSiteIndex();
    pIVar21 = IR::IndirOpnd::New((RegOpnd *)pIVar12,uVar11,TyUint16,(Func *)labelSkipBailOut,false);
    src = IR::Opnd::CreateProfileIdOpnd(helperLabel._6_2_,(Func *)labelSkipBailOut);
    InsertMove(&pIVar21->super_Opnd,&src->super_Opnd,pIStack_78,true);
    pIVar12 = insertInstr;
    uVar11 = Js::JavascriptNativeArray::GetOffsetOfWeakFuncRef();
    pIVar21 = IR::IndirOpnd::New((RegOpnd *)pIVar12,uVar11,TyInt64,(Func *)labelSkipBailOut,false);
    pAVar20 = IR::AddrOpnd::New((intptr_t)arrayInfo,AddrOpndKindDynamicFunctionBodyWeakRef,
                                (Func *)labelSkipBailOut,false,(Var)0x0);
    InsertMove(&pIVar21->super_Opnd,&pAVar20->super_Opnd,pIStack_78,true);
    IR::Instr::InsertBefore(pIStack_78,(Instr *)linkOpnd);
    this_local = (Lowerer *)RemoveLoweredRegionStartMarker(this,(Instr *)targetOpnd);
  }
  return (Instr *)this_local;
}

Assistant:

IR::Instr *
Lowerer::LowerNewScObjArray(IR::Instr *newObjInstr)
{
    if (newObjInstr->HasEmptyArgOutChain())
    {
        newObjInstr->FreeSrc2();
        return LowerNewScObjArrayNoArg(newObjInstr);
    }

    IR::Instr* startMarkerInstr = nullptr;

    IR::Opnd *targetOpnd = newObjInstr->GetSrc1();
    Func *func = newObjInstr->m_func;

    if (!targetOpnd->IsAddrOpnd())
    {
        if (!newObjInstr->HasBailOutInfo() || newObjInstr->OnlyHasLazyBailOut())
        {
            return this->LowerNewScObject(newObjInstr, true, true);
        }

        // Insert a temporary label before the instruction we're about to lower, so that we can return
        // the first instruction above that needs to be lowered after we're done - regardless of argument
        // list, StartCall, etc.
        startMarkerInstr = InsertLoweredRegionStartMarker(newObjInstr);

        // For whatever reason, we couldn't do a fixed function check on the call target.
        // Generate a runtime check on the target.
        Assert(
            newObjInstr->GetBailOutKind() == IR::BailOutOnNotNativeArray ||
            newObjInstr->GetBailOutKind() == BailOutInfo::WithLazyBailOut(IR::BailOutOnNotNativeArray)
        );
        IR::LabelInstr *labelSkipBailOut = IR::LabelInstr::New(Js::OpCode::Label, func);
        InsertCompareBranch(
            targetOpnd,
            LoadLibraryValueOpnd(newObjInstr, LibraryValue::ValueArrayConstructor),
            Js::OpCode::BrEq_A,
            true,
            labelSkipBailOut,
            newObjInstr);

        IR::ProfiledInstr *instrNew = IR::ProfiledInstr::New(newObjInstr->m_opcode, newObjInstr->UnlinkDst(), newObjInstr->UnlinkSrc1(), newObjInstr->UnlinkSrc2(), func);
        instrNew->u.profileId = newObjInstr->AsProfiledInstr()->u.profileId;
        newObjInstr->InsertAfter(instrNew);
        newObjInstr->m_opcode = Js::OpCode::BailOut;
        GenerateBailOut(newObjInstr);

        instrNew->InsertBefore(labelSkipBailOut);
        newObjInstr = instrNew;
    }
    else
    {
        // Insert a temporary label before the instruction we're about to lower, so that we can return
        // the first instruction above that needs to be lowered after we're done - regardless of argument
        // list, StartCall, etc.
        startMarkerInstr = InsertLoweredRegionStartMarker(newObjInstr);
    }

    intptr_t weakFuncRef = 0;
    Js::ArrayCallSiteInfo *arrayInfo = nullptr;
    intptr_t arrayInfoAddr = 0;
    Assert(newObjInstr->IsProfiledInstr());

    IR::RegOpnd *resultObjOpnd = newObjInstr->GetDst()->AsRegOpnd();
    IR::Instr * insertInstr = newObjInstr->m_next;

    Js::ProfileId profileId = static_cast<Js::ProfileId>(newObjInstr->AsProfiledInstr()->u.profileId);

    // We may not have profileId if we converted a NewScObject to NewScObjArray
    if (profileId != Js::Constants::NoProfileId)
    {
        arrayInfo = func->GetReadOnlyProfileInfo()->GetArrayCallSiteInfo(profileId);
        arrayInfoAddr = func->GetReadOnlyProfileInfo()->GetArrayCallSiteInfoAddr(profileId);
        Assert(arrayInfo);
        weakFuncRef = func->GetWeakFuncRef();
        Assert(weakFuncRef);
    }

    IR::LabelInstr * helperLabel = IR::LabelInstr::New(Js::OpCode::Label, func, true);
    IR::LabelInstr *labelDone = IR::LabelInstr::New(Js::OpCode::Label, func);
    IR::Opnd *linkOpnd = newObjInstr->GetSrc2();

    Assert(linkOpnd->IsSymOpnd());
    StackSym *linkSym = linkOpnd->AsSymOpnd()->m_sym->AsStackSym();
    Assert(linkSym->IsSingleDef());
    IR::Instr* argInstr = linkSym->GetInstrDef();
    IR::Opnd *opndOfArrayCtor = argInstr->GetSrc1();
    const uint16 upperBoundValue = 8;
    // Generate fast path only if it meets all the conditions:
    // 1. It is the only parameter and it is a likely int
    // 2a. If 1st parameter is a variable, emit fast path with checks
    // 2b. If 1st parameter is a constant, it is in range 0 and upperBoundValue (inclusive)
    if (opndOfArrayCtor->GetValueType().IsLikelyInt() && (opndOfArrayCtor->IsAddrOpnd() || opndOfArrayCtor->IsRegOpnd())) // #1
    {
        if ((linkSym->GetArgSlotNum() == 2)) // 1. It is the only parameter
        {
            AssertMsg(linkSym->IsArgSlotSym(), "Not an argSlot symbol...");
            linkOpnd = argInstr->GetSrc2();

            bool emittedFastPath = false;
            // 2a. If 1st parameter is a variable, emit fast path with checks
            if (opndOfArrayCtor->IsRegOpnd())
            {
                if (!opndOfArrayCtor->AsRegOpnd()->IsNotInt())
                {
                    // 3. GenerateFastPath
                    if (arrayInfo && arrayInfo->IsNativeIntArray())
                    {
                        emittedFastPath = GenerateProfiledNewScObjArrayFastPath<Js::JavascriptNativeIntArray>(newObjInstr, arrayInfo, arrayInfoAddr, weakFuncRef, helperLabel, labelDone, opndOfArrayCtor,
                                                                Js::JavascriptNativeIntArray::GetOffsetOfArrayCallSiteIndex(),
                                                                Js::JavascriptNativeIntArray::GetOffsetOfWeakFuncRef());
                    }
                    else if (arrayInfo && arrayInfo->IsNativeFloatArray())
                    {
                        emittedFastPath = GenerateProfiledNewScObjArrayFastPath<Js::JavascriptNativeFloatArray>(newObjInstr, arrayInfo, arrayInfoAddr, weakFuncRef, helperLabel, labelDone, opndOfArrayCtor,
                                                                  Js::JavascriptNativeFloatArray::GetOffsetOfArrayCallSiteIndex(),
                                                                  Js::JavascriptNativeFloatArray::GetOffsetOfWeakFuncRef());
                    }
                    else
                    {
                        emittedFastPath = GenerateProfiledNewScObjArrayFastPath<Js::JavascriptArray>(newObjInstr, arrayInfo, arrayInfoAddr, weakFuncRef, helperLabel, labelDone, opndOfArrayCtor, 0, 0);
                    }
                }
            }
            // 2b. If 1st parameter is a constant, it is in range 0 and upperBoundValue (inclusive)
            else
            {
                int32 length = linkSym->GetIntConstValue();
                if (length >= 0 && length <= upperBoundValue)
                {
                    emittedFastPath = GenerateProfiledNewScObjArrayFastPath(newObjInstr, arrayInfo, arrayInfoAddr, weakFuncRef, (uint32)length, labelDone, false);
                }
            }
            // Since we emitted fast path above, move the startCall/argOut instruction right before helper
            if (emittedFastPath)
            {
                linkSym = linkOpnd->AsRegOpnd()->m_sym->AsStackSym();
                AssertMsg(!linkSym->IsArgSlotSym() && linkSym->m_isSingleDef, "Arg tree not single def...");

                IR::Instr* startCallInstr = linkSym->m_instrDef;
                AssertMsg(startCallInstr->GetArgOutCount(false) == 2, "Generating ArrayFastPath for more than 1 parameter not allowed.");

                // Since we emitted fast path above, move the startCall/argOut instruction right before helper
                startCallInstr->Move(newObjInstr);
                argInstr->Move(newObjInstr);
            }
        }
    }
    newObjInstr->UnlinkSrc1();

    IR::Opnd *profileOpnd = IR::AddrOpnd::New(arrayInfoAddr, IR::AddrOpndKindDynamicArrayCallSiteInfo, func);
    this->m_lowererMD.LoadNewScObjFirstArg(newObjInstr, profileOpnd);

    IR::JnHelperMethod helperMethod = IR::HelperScrArr_ProfiledNewInstance;

    newObjInstr->SetSrc1(IR::HelperCallOpnd::New(helperMethod, func));
    newObjInstr = GenerateDirectCall(newObjInstr, targetOpnd, Js::CallFlags_New);

    IR::BranchInstr* branchInstr = InsertCompareBranch(
        IR::IndirOpnd::New(resultObjOpnd, 0, TyMachPtr, func),
        LoadVTableValueOpnd(insertInstr, VTableValue::VtableJavascriptArray),
        Js::OpCode::BrEq_A,
        true,
        labelDone,
        insertInstr);

    InsertObjectPoison(resultObjOpnd, branchInstr, insertInstr, true);
    // We know we have a native array, so store the weak ref and call site index.
    InsertMove(
        IR::IndirOpnd::New(resultObjOpnd, Js::JavascriptNativeArray::GetOffsetOfArrayCallSiteIndex(), TyUint16, func),
        IR::Opnd::CreateProfileIdOpnd(profileId, func),
        insertInstr);
    InsertMove(
        IR::IndirOpnd::New(resultObjOpnd, Js::JavascriptNativeArray::GetOffsetOfWeakFuncRef(), TyMachReg, func),
        IR::AddrOpnd::New(weakFuncRef, IR::AddrOpndKindDynamicFunctionBodyWeakRef, func),
        insertInstr);
    insertInstr->InsertBefore(labelDone);

    return RemoveLoweredRegionStartMarker(startMarkerInstr);
}